

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O1

Float pbrt::BeamDiffusionMS(Float sigma_s,Float sigma_a,Float g,Float eta,Float r)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  int i;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  Float FVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar23 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar31 [64];
  uint uVar32;
  uint uVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 in_XMM18 [16];
  undefined4 local_18;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  auVar31._4_60_ = in_register_00001244;
  auVar31._0_4_ = sigma_a;
  fVar4 = (1.0 - g) * sigma_s;
  fVar3 = fVar4 + sigma_a;
  auVar22 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar31._0_16_,ZEXT416((uint)fVar4));
  fVar19 = auVar22._0_4_ / (fVar3 * fVar3 * 3.0);
  auVar22._0_4_ = sigma_a / fVar19;
  auVar22._4_12_ = in_register_00001244._0_12_;
  auVar29._0_12_ = ZEXT412(0);
  auVar29._12_4_ = 0;
  auVar22 = vmaxss_avx(auVar22,auVar29);
  if (auVar22._0_4_ < 0.0) {
    auVar24._0_4_ = sqrtf(auVar22._0_4_);
    auVar24._4_60_ = extraout_var;
    auVar22 = auVar24._0_16_;
  }
  else {
    auVar22 = vsqrtss_avx(auVar22,auVar22);
  }
  FVar20 = FresnelMoment1(eta);
  auVar25._0_4_ = FresnelMoment2(eta);
  auVar25._4_60_ = extraout_var_00;
  auVar29 = SUB6416(ZEXT464(0x3f800000),0);
  auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar25._0_16_,auVar29);
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)FVar20),SUB6416(ZEXT464(0xc0000000),0),auVar29);
  auVar29 = vfmadd132ss_fma(auVar25._0_16_,auVar29,ZEXT416(0xc0400000));
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(auVar22,auVar14);
  iVar10 = 0;
  auVar23._0_12_ = ZEXT812(0);
  auVar23._12_4_ = 0;
  do {
    auVar15 = vcvtsi2ss_avx512f(in_XMM18,iVar10);
    auVar26._0_4_ = logf((auVar15._0_4_ + 0.5) / -100.0 + 1.0);
    auVar26._4_60_ = extraout_var_01;
    auVar15._8_4_ = 0x80000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar15._12_4_ = 0x80000000;
    auVar15 = vxorps_avx512vl(auVar26._0_16_,auVar15);
    auVar30._0_4_ = auVar15._0_4_ / fVar3;
    auVar30._4_12_ = auVar15._4_12_;
    auVar16 = vfmsub231ss_avx512f(auVar30,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)((fVar19 * -2.0 * auVar5._0_4_) / auVar6._0_4_)));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar30._0_4_)),ZEXT416((uint)r),
                              ZEXT416((uint)r));
    uVar32 = auVar16._0_4_;
    if (auVar15._0_4_ < 0.0) {
      auVar27._0_4_ = sqrtf(auVar15._0_4_);
      auVar27._4_60_ = extraout_var_02;
      auVar16 = ZEXT416(uVar32);
      auVar15 = auVar27._0_16_;
    }
    else {
      auVar15 = vsqrtss_avx(auVar15,auVar15);
    }
    auVar17 = vmulss_avx512f(auVar16,auVar16);
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)r),ZEXT416((uint)r));
    if (auVar17._0_4_ < 0.0) {
      auVar28._0_4_ = sqrtf(auVar17._0_4_);
      auVar28._4_60_ = extraout_var_03;
      auVar17 = auVar28._0_16_;
      auVar16 = ZEXT416(uVar32);
      auVar15 = ZEXT416(auVar15._0_4_);
    }
    else {
      auVar17 = vsqrtss_avx(auVar17,auVar17);
    }
    local_18 = auVar14._0_4_;
    fVar39 = auVar15._0_4_;
    fVar11 = fVar39 * local_18 * 1.442695;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
    fVar11 = fVar11 - auVar18._0_4_;
    auVar36 = SUB6416(ZEXT464(0x3da00ac9),0);
    auVar37 = SUB6416(ZEXT464(0x3e679a0b),0);
    auVar7 = vfmadd213ss_fma(auVar36,ZEXT416((uint)fVar11),auVar37);
    auVar38 = SUB6416(ZEXT464(0x3f321004),0);
    auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar11),auVar38);
    auVar35 = SUB6416(ZEXT464(0x3f800000),0);
    auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar11),auVar35);
    uVar32 = auVar7._0_4_;
    iVar1 = (int)auVar18._0_4_ + -0x7f + (uVar32 >> 0x17);
    fVar11 = 0.0;
    if ((-0x7f < iVar1) && (fVar11 = INFINITY, iVar1 < 0x80)) {
      fVar11 = (float)(iVar1 * 0x800000 + 0x3f800000U | uVar32 & 0x807fffff);
    }
    fVar21 = auVar17._0_4_;
    fVar13 = local_18 * fVar21 * 1.442695;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),9);
    fVar13 = fVar13 - auVar18._0_4_;
    auVar7 = vfmadd213ss_fma(auVar36,ZEXT416((uint)fVar13),auVar37);
    auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar13),auVar38);
    auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar13),auVar35);
    uVar33 = auVar7._0_4_;
    iVar2 = (int)auVar18._0_4_ + -0x7f + (uVar33 >> 0x17);
    fVar13 = 0.0;
    if ((-0x7f < iVar2) && (fVar13 = INFINITY, iVar2 < 0x80)) {
      fVar13 = (float)(iVar2 * 0x800000 + 0x3f800000U | uVar33 & 0x807fffff);
    }
    auVar18 = vfmadd213ss_fma(auVar15,auVar22,auVar35);
    fVar34 = INFINITY;
    fVar8 = 0.0;
    if ((-0x7f < iVar1) && (fVar8 = fVar34, iVar1 < 0x80)) {
      fVar8 = (float)(iVar1 * 0x800000 + 0x3f800000U | uVar32 & 0x807fffff);
    }
    auVar17 = vfmadd213ss_fma(auVar17,auVar22,auVar35);
    fVar12 = 0.0;
    if ((-0x7f < iVar2) && (fVar12 = fVar34, iVar2 < 0x80)) {
      fVar12 = (float)(iVar2 * 0x800000 + 0x3f800000U | uVar33 & 0x807fffff);
    }
    auVar18 = vmulss_avx512f(ZEXT416((uint)auVar30._0_4_),auVar18);
    auVar17 = vmulss_avx512f(auVar16,auVar17);
    auVar15 = vaddss_avx512f(auVar15,ZEXT416((uint)auVar30._0_4_));
    fVar9 = auVar15._0_4_ * fVar3 * -2.0 * 1.442695;
    auVar15 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
    fVar9 = fVar9 - auVar15._0_4_;
    auVar16 = vfmadd213ss_fma(auVar36,ZEXT416((uint)fVar9),auVar37);
    auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar9),auVar38);
    auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar9),auVar35);
    iVar1 = (int)auVar15._0_4_ + -0x7f + (auVar16._0_4_ >> 0x17);
    fVar9 = 0.0;
    if ((-0x7f < iVar1) && (fVar9 = fVar34, iVar1 < 0x80)) {
      fVar9 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar16._0_4_ & 0x807fffff);
    }
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(((auVar18._0_4_ * fVar8) / (fVar39 * fVar39 * fVar39) -
                                             (auVar17._0_4_ * fVar12) / (fVar21 * fVar21 * fVar21))
                                             * 0.07957747 * auVar29._0_4_ * 0.5)),
                              ZEXT416((uint)((fVar11 / fVar39 - fVar13 / fVar21) *
                                            (0.07957747 / fVar19))),
                              ZEXT416((uint)(auVar6._0_4_ * 0.25)));
    auVar23 = vfmadd213ss_fma(ZEXT416((uint)((fVar4 / fVar3) * (fVar4 / fVar3) * (1.0 - fVar9))),
                              auVar15,ZEXT416(auVar23._0_4_));
    iVar10 = iVar10 + 1;
  } while (iVar10 != 100);
  return auVar23._0_4_ / 100.0;
}

Assistant:

Float BeamDiffusionMS(Float sigma_s, Float sigma_a, Float g, Float eta, Float r) {
    const int nSamples = 100;
    Float Ed = 0;
    // Precompute information for dipole integrand
    // Compute reduced scattering coefficients $\sigmaps, \sigmapt$ and albedo $\rhop$
    Float sigmap_s = sigma_s * (1 - g);
    Float sigmap_t = sigma_a + sigmap_s;
    Float rhop = sigmap_s / sigmap_t;

    // Compute non-classical diffusion coefficient $D_\roman{G}$ using Equation
    // $(\ref{eq:diffusion-coefficient-grosjean})$
    Float D_g = (2 * sigma_a + sigmap_s) / (3 * sigmap_t * sigmap_t);

    // Compute effective transport coefficient $\sigmatr$ based on $D_\roman{G}$
    Float sigma_tr = SafeSqrt(sigma_a / D_g);

    // Determine linear extrapolation distance $\depthextrapolation$ using Equation
    // $(\ref{eq:dipole-boundary-condition})$
    Float fm1 = FresnelMoment1(eta), fm2 = FresnelMoment2(eta);
    Float ze = -2 * D_g * (1 + 3 * fm2) / (1 - 2 * fm1);

    // Determine exitance scale factors using Equations $(\ref{eq:kp-exitance-phi})$ and
    // $(\ref{eq:kp-exitance-e})$
    Float cPhi = .25f * (1 - 2 * fm1), cE = .5f * (1 - 3 * fm2);

    for (int i = 0; i < nSamples; ++i) {
        // Sample real point source depth $\depthreal$
        Float zr = -std::log(1 - (i + .5f) / nSamples) / sigmap_t;

        // Evaluate dipole integrand $E_{\roman{d}}$ at $\depthreal$ and add to _Ed_
        Float zv = -zr + 2 * ze;
        Float dr = std::sqrt(r * r + zr * zr), dv = std::sqrt(r * r + zv * zv);
        // Compute dipole fluence rate $\dipole(r)$ using Equation
        // $(\ref{eq:diffusion-dipole})$
        Float phiD =
            Inv4Pi / D_g * (FastExp(-sigma_tr * dr) / dr - FastExp(-sigma_tr * dv) / dv);

        // Compute dipole vector irradiance $-\N{}\cdot\dipoleE(r)$ using Equation
        // $(\ref{eq:diffusion-dipole-vector-irradiance-normal})$
        Float EDn = Inv4Pi *
                    (zr * (1 + sigma_tr * dr) * FastExp(-sigma_tr * dr) / (dr * dr * dr) -
                     zv * (1 + sigma_tr * dv) * FastExp(-sigma_tr * dv) / (dv * dv * dv));

        // Add contribution from dipole for depth $\depthreal$ to _Ed_
        Float E = phiD * cPhi + EDn * cE;
        Float kappa = 1 - FastExp(-2 * sigmap_t * (dr + zr));
        Ed += kappa * rhop * rhop * E;
    }
    return Ed / nSamples;
}